

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall
ON_NurbsCurve::IsArc(ON_NurbsCurve *this,ON_Plane *plane,ON_Arc *arc,double tolerance)

{
  double *pdVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  iVar6 = ON_KnotCount(this->m_order,this->m_cv_count);
  if ((this->m_dim & 0xfffffffeU) == 2) {
    iVar2 = this->m_order;
    if ((((2 < iVar2 && iVar2 <= this->m_cv_count) &&
         (pdVar3 = this->m_knot, pdVar3 != (double *)0x0)) && (this->m_cv != (double *)0x0)) &&
       ((2.3283064365386963e-10 < tolerance || (this->m_is_rat != 0)))) {
      if (tolerance <= 2.3283064365386963e-10) {
        uVar7 = iVar2 - 1;
        if (iVar6 % (int)uVar7 != 0) {
          return false;
        }
        lVar8 = 0;
        while (lVar8 < this->m_cv_count) {
          pdVar1 = pdVar3 + lVar8;
          lVar4 = lVar8 + -1;
          lVar8 = lVar8 + (ulong)uVar7;
          if (*pdVar1 != pdVar3[(ulong)uVar7 + lVar4]) {
            return false;
          }
          if (NAN(*pdVar1) || NAN(pdVar3[(ulong)uVar7 + lVar4])) {
            return false;
          }
        }
      }
      iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                        (tolerance,this);
      if (((char)iVar6 == '\0') &&
         (bVar5 = ON_Curve::IsArc(&this->super_ON_Curve,plane,arc,tolerance), bVar5)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
ON_NurbsCurve::IsArc(
      const ON_Plane* plane,
      ON_Arc* arc,
      double tolerance
      ) const
{
  // If changes are made, verify that RR 8497 still works.
  // On 30 April 2003, Mikko changed the strict test to a sloppy
  // test to fix RR 8497.  This change broke other things like 
  // IGES simple entity export tests that require a strict test.
  // So on 6 May 2003 Dale Lear added in the "bLooseTest" check.
  // If the tolerance > ON_ZERO_TOLERANCE a fuzzy fit to arc
  // arc test is performed.  If tolerance <= ON_ZERO_TOLERANCE,
  // a stricter arc test is performed.
  const bool bLooseTest = (tolerance > ON_ZERO_TOLERANCE);
  const int knotcount = KnotCount();
  const int degree = m_order-1;
  if ( (2 == m_dim || 3 == m_dim)
       && m_cv_count >= m_order
       && degree >= 2
       && 0 != m_knot
       && 0 != m_cv
       && (bLooseTest || 0 != m_is_rat)
       )
  {
    if ( bLooseTest || 0 == (knotcount % degree) )
    {

      if ( !bLooseTest )
      {
        for ( int i = 0; i < m_cv_count; i += degree )
        {
          if ( m_knot[i] != m_knot[i+degree-1] )
            return false;
        }
      }

      // 24 July 2012 Dale Lear
      //   You can't be a line and an arc.  This test prevents
      //   creating arcs with small angles and large radii and
      //   prevents sloppy tolerances from classifying a span
      //   as an arc when it makes no sense.
      if ( IsLinear(tolerance) )
        return false;

      if ( ON_Curve::IsArc( plane, arc, tolerance ) )
        return true;
    }
  }

  return false;
}